

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O0

void distfleeck(monst *mtmp,int *inrange,int *nearby,int *scared)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  byte local_34;
  byte local_33;
  byte local_32;
  bool local_31;
  int local_30;
  int local_2c;
  int seescaryy;
  int seescaryx;
  int *scared_local;
  int *nearby_local;
  int *inrange_local;
  monst *mtmp_local;
  
  iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mtmp->mux,(int)mtmp->muy);
  *inrange = (uint)(iVar4 < 0x41);
  local_31 = false;
  if (*inrange != 0) {
    bVar3 = monnear(mtmp,(int)mtmp->mux,(int)mtmp->muy);
    local_31 = bVar3 != '\0';
  }
  *nearby = (uint)local_31;
  if (((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0) ||
     (((((cVar1 = u.uy, cVar2 = u.ux, u.uprops[0xd].intrinsic != 0 || (u.uprops[0xd].extrinsic != 0)
         ) || (youmonst.data == mons + 0x9e)) || (youmonst.data == mons + 0x7b)) &&
      ((u.uprops[0xd].blocked == 0 && ((mtmp->data->mflags1 & 0x1000000) == 0)))))) {
    cVar1 = mtmp->muy;
    cVar2 = mtmp->mux;
  }
  local_2c = (int)cVar2;
  local_30 = (int)cVar1;
  local_32 = 0;
  if (*nearby != 0) {
    bVar3 = onscary(local_2c,local_30,mtmp);
    local_33 = 1;
    if (bVar3 == '\0') {
      local_34 = 0;
      if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
        bVar3 = in_your_sanctuary(mtmp,'\0','\0');
        local_34 = 0;
        if (bVar3 != '\0') {
          bVar3 = on_level(&u.uz,&dungeon_topology.d_astral_level);
          local_34 = bVar3 != '\0' ^ 0xff;
        }
      }
      local_33 = local_34;
    }
    local_32 = local_33;
  }
  *scared = (uint)(local_32 & 1);
  if (*scared != 0) {
    iVar4 = rn2(7);
    if (iVar4 == 0) {
      iVar4 = rnd(100);
      monflee(mtmp,iVar4,'\x01','\x01');
    }
    else {
      iVar4 = rnd(10);
      monflee(mtmp,iVar4,'\x01','\x01');
    }
  }
  return;
}

Assistant:

static void distfleeck(struct monst *mtmp, int *inrange, int *nearby, int *scared)
{
	int seescaryx, seescaryy;

	*inrange = (dist2(mtmp->mx, mtmp->my, mtmp->mux, mtmp->muy) <=
							(BOLT_LIM * BOLT_LIM));
	*nearby = *inrange && monnear(mtmp, mtmp->mux, mtmp->muy);

	/* Note: if your image is displaced, the monster sees the Elbereth
	 * at your displaced position, thus never attacking your displaced
	 * position, but possibly attacking you by accident.  If you are
	 * invisible, it sees the Elbereth at your real position, thus never
	 * running into you by accident but possibly attacking the spot
	 * where it guesses you are.
	 */
	if (!mtmp->mcansee || (Invis && !perceives(mtmp->data))) {
		seescaryx = mtmp->mux;
		seescaryy = mtmp->muy;
	} else {
		seescaryx = u.ux;
		seescaryy = u.uy;
	}
	*scared = (*nearby && (onscary(seescaryx, seescaryy, mtmp) ||
			       (!mtmp->mpeaceful &&
				in_your_sanctuary(mtmp, 0, 0) &&
				/* don't warn due to fleeing monsters about
				 * the right temple on Astral */
				!Is_astralevel(&u.uz))));

	if (*scared) {
		if (rn2(7))
		    monflee(mtmp, rnd(10), TRUE, TRUE);
		else
		    monflee(mtmp, rnd(100), TRUE, TRUE);
	}

}